

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

DOHcode doh_rdata(uchar *doh,size_t dohlen,unsigned_short rdlength,unsigned_short type,int index,
                 dohentry *d)

{
  anon_union_16_2_f9ece763_for_ip *paVar1;
  byte bVar2;
  undefined8 uVar3;
  CURLcode CVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  int iVar8;
  undefined6 in_register_0000000a;
  dynbuf *s;
  DOHcode DVar9;
  bool bVar10;
  
  iVar8 = (int)CONCAT62(in_register_0000000a,type);
  if (iVar8 == 0x1c) {
    if (rdlength != 0x10) {
      return DOH_DNS_RDATA_LEN;
    }
    iVar8 = d->numaddr;
    lVar5 = (long)iVar8;
    if (0x17 < lVar5) {
      return DOH_OK;
    }
    d->addr[lVar5].type = 0x1c;
    uVar3 = *(undefined8 *)(doh + index + 8);
    paVar1 = &d->addr[lVar5].ip;
    *(undefined8 *)paVar1 = *(undefined8 *)(doh + index);
    *(undefined8 *)((long)paVar1 + 8) = uVar3;
  }
  else {
    if (iVar8 == 5) {
      iVar8 = d->numcname;
      DVar9 = DOH_OK;
      if ((long)iVar8 != 4) {
        d->numcname = iVar8 + 1;
        s = d->cname + iVar8;
        iVar8 = -0x7f;
        do {
          DVar9 = DOH_DNS_OUT_OF_RANGE;
          if (dohlen <= (uint)index) goto LAB_00126989;
          bVar2 = doh[(uint)index];
          DVar9 = DOH_DNS_BAD_LABEL;
          if ((bVar2 & 0xc0) == 0) {
            index = index + 1;
            uVar6 = (ulong)(uint)index;
            if ((ulong)bVar2 != 0) {
              sVar7 = Curl_dyn_len(s);
              if ((sVar7 == 0) || (CVar4 = Curl_dyn_addn(s,".",1), CVar4 == CURLE_OK)) {
                index = index + (uint)bVar2;
                if (dohlen < (uint)index) goto LAB_00126989;
                CVar4 = Curl_dyn_addn(s,doh + uVar6,(ulong)bVar2);
                if (CVar4 == CURLE_OK) goto LAB_00126917;
              }
              DVar9 = DOH_OUT_OF_MEM;
              goto LAB_00126989;
            }
          }
          else {
            if ((bVar2 & 0xc0) != 0xc0) goto LAB_00126989;
            uVar6 = (ulong)(index + 1);
            if (uVar6 < dohlen) {
              index = (uint)doh[uVar6] | (bVar2 & 0x3f) << 8;
            }
            DVar9 = DOH_DNS_OUT_OF_RANGE;
            if (dohlen <= uVar6) goto LAB_00126989;
          }
LAB_00126917:
        } while ((bVar2 != 0) && (bVar10 = iVar8 != 0, iVar8 = iVar8 + 1, bVar10));
        DVar9 = (uint)(bVar2 != 0) * 3;
      }
LAB_00126989:
      if (DVar9 == DOH_OK) {
        return DOH_OK;
      }
      return DVar9;
    }
    if (iVar8 != 1) {
      return DOH_OK;
    }
    if (rdlength != 4) {
      return DOH_DNS_RDATA_LEN;
    }
    iVar8 = d->numaddr;
    lVar5 = (long)iVar8;
    if (0x17 < lVar5) {
      return DOH_OK;
    }
    d->addr[lVar5].type = 1;
    *(undefined4 *)&d->addr[lVar5].ip = *(undefined4 *)(doh + index);
  }
  d->numaddr = iVar8 + 1;
  return DOH_OK;
}

Assistant:

static DOHcode doh_rdata(const unsigned char *doh,
                         size_t dohlen,
                         unsigned short rdlength,
                         unsigned short type,
                         int index,
                         struct dohentry *d)
{
  /* RDATA
     - A (TYPE 1):  4 bytes
     - AAAA (TYPE 28): 16 bytes
     - NS (TYPE 2): N bytes
     - HTTPS (TYPE 65): N bytes */
  DOHcode rc;

  switch(type) {
  case DNS_TYPE_A:
    if(rdlength != 4)
      return DOH_DNS_RDATA_LEN;
    doh_store_a(doh, index, d);
    break;
  case DNS_TYPE_AAAA:
    if(rdlength != 16)
      return DOH_DNS_RDATA_LEN;
    doh_store_aaaa(doh, index, d);
    break;
#ifdef USE_HTTPSRR
  case DNS_TYPE_HTTPS:
    rc = doh_store_https(doh, index, d, rdlength);
    if(rc)
      return rc;
    break;
#endif
  case DNS_TYPE_CNAME:
    rc = doh_store_cname(doh, dohlen, (unsigned int)index, d);
    if(rc)
      return rc;
    break;
  case DNS_TYPE_DNAME:
    /* explicit for clarity; just skip; rely on synthesized CNAME  */
    break;
  default:
    /* unsupported type, just skip it */
    break;
  }
  return DOH_OK;
}